

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void open_local_endpoint(connection *conn,int skip_user)

{
  mg_connection *c;
  uint *puVar1;
  mg_server *pmVar2;
  char *__s;
  undefined8 __ptr;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *__s_00;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  FILE *pFVar9;
  char *pcVar10;
  int *piVar11;
  longlong lVar12;
  long lVar13;
  file_stat_t *stp;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  int64_t r1;
  int64_t local_8200;
  size_t local_81f8;
  char *local_81f0;
  char proto [10];
  file_stat_t st;
  int n;
  char path [8192];
  char addr [1000];
  
  conn->endpoint_type = EP_NONE;
  if ((conn->server->event_handler != (mg_handler_t)0x0) &&
     (iVar3 = call_user(conn,MG_AUTH), iVar3 == 0)) {
    mg_send_digest_auth_request(&conn->mg_conn);
    return;
  }
  if ((skip_user == 0) && (conn->server->event_handler != (mg_handler_t)0x0)) {
    conn->endpoint_type = EP_USER;
    return;
  }
  c = &conn->mg_conn;
  pcVar8 = (conn->mg_conn).request_method;
  iVar3 = strcmp(pcVar8,"CONNECT");
  if (iVar3 == 0) {
LAB_0010b345:
    pcVar8 = conn->server->config_options[8];
    if ((pcVar8 == (char *)0x0) || (iVar3 = strcmp(pcVar8,"yes"), iVar3 != 0)) {
      send_http_error(conn,0x195,(char *)0x0);
      return;
    }
    st.st_dev._0_2_ = 0x50;
    n = 0;
    pcVar8 = (conn->mg_conn).uri;
    path[0] = '\0';
    proto._0_8_ = proto._0_8_ & 0xffffffffffffff00;
    iVar3 = __isoc99_sscanf(pcVar8,"%499[^: ]:%hu%n");
    if (((iVar3 != 2) &&
        (iVar3 = __isoc99_sscanf(pcVar8,"%9[a-z]://%499[^: ]:%hu%n",proto,path,&st,&n), iVar3 != 3))
       && (iVar3 = __isoc99_sscanf(pcVar8,"%9[a-z]://%499[^/ ]%n",proto,path,&n), iVar3 != 2)) {
      n = 0;
    }
    pcVar8 = "ssl";
    if (conn->ns_conn->ssl == (SSL *)0x0) {
      pcVar8 = "tcp";
    }
    snprintf(addr,1000,"%s://%s:%hu",pcVar8,path,(ulong)(ushort)st.st_dev);
    if ((0 < n) && (iVar3 = mg_forward(c,addr), iVar3 != 0)) {
      return;
    }
    puVar1 = &conn->ns_conn->flags;
    *puVar1 = *puVar1 | 0x10;
    return;
  }
  pcVar10 = (conn->mg_conn).uri;
  iVar3 = mg_strncasecmp(pcVar10,"http",4);
  if (iVar3 == 0) goto LAB_0010b345;
  iVar3 = strcmp(pcVar8,"OPTIONS");
  if (iVar3 == 0) {
    send_options(conn);
    return;
  }
  pmVar2 = conn->server;
  pcVar8 = pmVar2->config_options[0x11];
  __s = pmVar2->config_options[4];
  pcVar7 = pmVar2->config_options[6];
  __s_00 = mg_get_header(c,"Host");
  if (pcVar7 == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = strlen(pcVar7);
  }
  if (__s_00 != (char *)0x0 && pcVar8 != (char *)0x0) {
    local_81f8 = sVar6;
    local_81f0 = pcVar7;
    pcVar7 = strchr(__s_00,0x3a);
    if (pcVar7 == (char *)0x0) {
      sVar6 = strlen(__s_00);
      iVar3 = (int)sVar6;
    }
    else {
      iVar3 = (int)pcVar7 - (int)__s_00;
    }
    do {
      pcVar8 = next_option(pcVar8,(vec *)addr,(vec *)proto);
      sVar6 = local_81f8;
      pcVar7 = local_81f0;
      if (pcVar8 == (char *)0x0) goto LAB_0010b5db;
    } while (((((int)addr._8_4_ < 2) || (*(char *)addr._0_8_ != '@')) || (addr._8_4_ != iVar3 + 1))
            || (iVar4 = mg_strncasecmp((char *)(addr._0_8_ + 1),__s_00,(long)iVar3), iVar4 != 0));
    sVar6 = (ulong)stack0xffffffffffff7e20;
    pcVar7 = (char *)proto._0_8_;
  }
LAB_0010b5db:
  iVar3 = 0;
  bVar16 = true;
  if ((int)sVar6 != 0 && pcVar7 != (char *)0x0) {
    mg_snprintf(path,0x2000,"%.*s%s",sVar6 & 0xffffffff,pcVar7,pcVar10);
    pcVar8 = conn->server->config_options[0x11];
    do {
      pcVar8 = next_option(pcVar8,(vec *)addr,(vec *)proto);
      if (pcVar8 == (char *)0x0) goto LAB_0010b694;
      uVar5 = mg_match_prefix((char *)addr._0_8_,addr._8_4_,pcVar10);
    } while ((int)uVar5 < 1);
    mg_snprintf(path,0x2000,"%.*s%s",(ulong)stack0xffffffffffff7e20,proto._0_8_,pcVar10 + uVar5);
LAB_0010b694:
    iVar4 = stat64(path,(stat64 *)&st);
    iVar3 = 1;
    if (iVar4 != 0) {
      sVar6 = strlen(pcVar7);
      pcVar8 = path + sVar6 + 2;
      do {
        if (*pcVar8 == '/') {
          *pcVar8 = '\0';
          sVar6 = strlen(__s);
          iVar3 = mg_match_prefix(__s,(int)sVar6,path);
          if ((0 < iVar3) && (iVar3 = stat64(path,(stat64 *)&st), iVar3 == 0)) {
            *pcVar8 = '/';
            pcVar10 = mg_strdup(pcVar8);
            conn->path_info = pcVar10;
            *pcVar8 = '\0';
            bVar16 = false;
            iVar3 = 1;
            goto LAB_0010b759;
          }
          *pcVar8 = '/';
        }
        else if (*pcVar8 == '\0') goto LAB_0010b722;
        pcVar8 = pcVar8 + 1;
      } while( true );
    }
    bVar16 = false;
  }
LAB_0010b759:
  iVar4 = strcmp(c->request_method,"OPTIONS");
  if (iVar4 == 0) {
    send_options(conn);
    return;
  }
  pmVar2 = conn->server;
  if (pmVar2->config_options[6] != (char *)0x0) {
    iVar4 = is_dav_request(conn);
    if (iVar4 == 0) {
      pcVar8 = pmVar2->config_options[10];
      if (pcVar8 == (char *)0x0) {
        if ((st.st_mode & 0xf000) == 0x4000 && !bVar16) {
          pcVar8 = addr;
          mg_snprintf(pcVar8,0x2000,"%s%c%s",path,0x2f,".htpasswd");
        }
        else {
          pcVar8 = strrchr(path,0x2f);
          iVar15 = (int)path;
          iVar4 = (int)pcVar8;
          if (pcVar8 == (char *)0x0) {
            iVar4 = iVar15;
          }
          pcVar8 = addr;
          mg_snprintf(pcVar8,0x2000,"%.*s%c%s",(ulong)(uint)(iVar4 - iVar15),path,0x2f,".htpasswd");
        }
      }
      pFVar9 = fopen64(pcVar8,"r");
      if (pFVar9 == (FILE *)0x0) goto LAB_0010b792;
      iVar4 = mg_authorize_digest(c,(FILE *)pFVar9);
      fclose(pFVar9);
      if (iVar4 != 0) goto LAB_0010b792;
      goto LAB_0010ba39;
    }
LAB_0010b792:
    iVar4 = is_dav_request(conn);
    if (iVar4 != 0) {
      pcVar8 = conn->server->config_options[5];
      pcVar10 = (conn->mg_conn).request_method;
      if ((pcVar10 == (char *)0x0) ||
         (iVar4 = strcmp(pcVar10,"PROPFIND"), iVar4 != 0 || pcVar8 != (char *)0x0)) {
        if ((pcVar8 != (char *)0x0) && (pFVar9 = fopen64(pcVar8,"r"), pFVar9 != (FILE *)0x0)) {
          iVar4 = mg_authorize_digest(c,(FILE *)pFVar9);
          fclose(pFVar9);
          if (iVar4 != 0) goto LAB_0010b81a;
        }
LAB_0010ba39:
        mg_send_digest_auth_request(c);
        goto LAB_0010ba44;
      }
    }
LAB_0010b81a:
    iVar4 = must_hide_file(conn,path);
    if (iVar4 == 0) {
      pcVar8 = c->request_method;
      iVar4 = strcmp(pcVar8,"PROPFIND");
      if (iVar4 == 0) {
        pcVar10 = mg_get_header(c,"Depth");
        pcVar8 = conn->server->config_options[7];
        (conn->mg_conn).status_code = 0xcf;
        if (bVar16) {
          (conn->mg_conn).status_code = 0x194;
          pcVar8 = "HTTP/1.1 404 Not Found\r\n\r\n";
        }
        else {
          if (((st.st_mode & 0xf000) != 0x4000) || (iVar3 = mg_strcasecmp(pcVar8,"yes"), iVar3 == 0)
             ) {
            ns_out(conn->ns_conn,
                   "HTTP/1.1 207 Multi-Status\r\nConnection: close\r\nContent-Type: text/xml; charset=utf-8\r\n\r\n<?xml version=\"1.0\" encoding=\"utf-8\"?><d:multistatus xmlns:d=\'DAV:\'>\n"
                   ,0x9c);
            print_props(conn,(conn->mg_conn).uri,&st);
            if (((st.st_mode & 0xf000) == 0x4000) &&
               (((pcVar10 == (char *)0x0 || (*pcVar10 != '0')) || (pcVar10[1] != '\0')))) {
              proto[0] = '\0';
              proto[1] = '\0';
              proto[2] = '\0';
              proto[3] = '\0';
              proto[4] = '\0';
              proto[5] = '\0';
              proto[6] = '\0';
              proto[7] = '\0';
              uVar5 = scan_directory(conn,path,(dir_entry **)proto);
              __ptr = proto._0_8_;
              uVar14 = 0;
              if (0 < (int)uVar5) {
                uVar14 = (ulong)uVar5;
              }
              stp = (file_stat_t *)(proto._0_8_ + 0x10);
              while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
                pcVar8 = (char *)stp[-1].__glibc_reserved[2];
                sVar6 = strlen(pcVar8);
                mg_url_encode(pcVar8,sVar6,addr,0x6000);
                print_props(conn,addr,stp);
                free((void *)stp[-1].__glibc_reserved[2]);
                stp = (file_stat_t *)&stp[1].st_nlink;
              }
              free((void *)__ptr);
            }
            ns_out(conn->ns_conn,"</d:multistatus>",0x10);
            goto LAB_0010ba44;
          }
          (conn->mg_conn).status_code = 0x193;
          pcVar8 = "HTTP/1.1 403 Directory Listing Denied\r\n\r\n";
        }
        mg_printf(c,"%s",pcVar8);
LAB_0010ba44:
        close_local_endpoint(conn);
        return;
      }
      iVar4 = strcmp(pcVar8,"MKCOL");
      if (iVar4 == 0) {
        iVar3 = 0x19f;
        if ((conn->mg_conn).content_len == 0) {
          iVar3 = mkdir(path,0x1ed);
          if (iVar3 == 0) {
            iVar3 = 0xc9;
          }
          else {
            piVar11 = __errno_location();
            iVar3 = *piVar11;
            if (iVar3 == 2) {
              iVar3 = 0x199;
            }
            else if (iVar3 == 0x11) {
              iVar3 = 0x195;
            }
            else if (iVar3 == 0xd) {
              iVar3 = 0x193;
            }
            else {
              iVar3 = 500;
            }
          }
        }
      }
      else {
        iVar4 = strcmp(pcVar8,"DELETE");
        if (iVar4 != 0) {
          iVar4 = strcmp(pcVar8,"PUT");
          if (iVar4 != 0) {
            mg_send_file_internal(c,path,&st,iVar3,(char *)0x0);
            return;
          }
          pcVar10 = mg_get_header(c,"Content-Length");
          iVar3 = stat64(path,(stat64 *)&n);
          (conn->mg_conn).status_code = 0xc9 - (uint)(iVar3 == 0);
          pcVar8 = path;
          do {
            pcVar8 = strchr(pcVar8 + 1,0x2f);
            if (pcVar8 == (char *)0x0) {
              if (pcVar10 != (char *)0x0) {
                iVar3 = open64(path,0x242,0x1a4);
                (conn->endpoint).fd = iVar3;
                if (-1 < iVar3) {
                  conn->endpoint_type = EP_PUT;
                  ns_set_close_on_exec(iVar3);
                  pcVar8 = mg_get_header(c,"Content-Range");
                  lVar12 = strtoll(pcVar10,(char **)0x0,10);
                  conn->cl = lVar12;
                  local_8200 = 0;
                  r1 = 0;
                  if ((pcVar8 != (char *)0x0) &&
                     (iVar3 = parse_range_header(pcVar8,&r1,&local_8200), 0 < iVar3)) {
                    (conn->mg_conn).status_code = 0xce;
                    lseek64((conn->endpoint).fd,r1,0);
                    if (r1 < local_8200) {
                      lVar13 = local_8200 + 1;
                    }
                    else {
                      lVar13 = conn->cl;
                    }
                    conn->cl = lVar13 - r1;
                  }
                  mg_printf(c,"HTTP/1.1 %d OK\r\nContent-Length: 0\r\n\r\n",
                            (ulong)(uint)(conn->mg_conn).status_code);
                  return;
                }
                piVar11 = __errno_location();
                pcVar8 = strerror(*piVar11);
                send_http_error(conn,500,"open(%s): %s",path,pcVar8);
                return;
              }
              iVar3 = 0x19b;
              goto LAB_0010b83d;
            }
            sVar6 = (long)pcVar8 - (long)path;
            if (0x1fff < (long)sVar6) {
LAB_0010bd31:
              piVar11 = __errno_location();
              pcVar8 = strerror(*piVar11);
              send_http_error(conn,500,"put_dir: %s",pcVar8);
              return;
            }
            memcpy(addr,path,sVar6);
            addr[sVar6] = '\0';
            iVar3 = stat64(addr,(stat64 *)proto);
            if ((iVar3 != 0) && (iVar3 = mkdir(addr,0x1ed), iVar3 != 0)) goto LAB_0010bd31;
          } while (pcVar8[1] != '\0');
          mg_printf(c,"HTTP/1.1 %d OK\r\n\r\n",(ulong)(uint)(conn->mg_conn).status_code);
          goto LAB_0010ba44;
        }
        iVar4 = stat64(path,(stat64 *)addr);
        iVar3 = 0x194;
        if (iVar4 == 0) {
          if ((addr._24_4_ & 0xf000) == 0x4000) {
            remove_directory(path);
            iVar3 = 0xcc;
          }
          else {
            iVar4 = remove(path);
            iVar3 = 0x1a7;
            if (iVar4 == 0) {
              iVar3 = 0xcc;
            }
          }
        }
      }
      goto LAB_0010b83d;
    }
  }
  iVar3 = 0x194;
LAB_0010b83d:
  send_http_error(conn,iVar3,(char *)0x0);
  return;
LAB_0010b722:
  iVar3 = 0;
  bVar16 = true;
  goto LAB_0010b759;
}

Assistant:

static void open_local_endpoint(struct connection *conn, int skip_user) {
#ifndef MONGOOSE_NO_FILESYSTEM
  char path[MAX_PATH_SIZE];
  file_stat_t st;
  int exists = 0;
#endif

  // If EP_USER was set in a prev call, reset it
  conn->endpoint_type = EP_NONE;

#ifndef MONGOOSE_NO_AUTH
  if (conn->server->event_handler && call_user(conn, MG_AUTH) == MG_FALSE) {
    mg_send_digest_auth_request(&conn->mg_conn);
    return;
  }
#endif

  // Call URI handler if one is registered for this URI
  if (skip_user == 0 && conn->server->event_handler != NULL) {
    conn->endpoint_type = EP_USER;
#if MONGOOSE_POST_SIZE_LIMIT > 1
    {
      const char *cl = mg_get_header(&conn->mg_conn, "Content-Length");
      if ((strcmp(conn->mg_conn.request_method, "POST") == 0 ||
           strcmp(conn->mg_conn.request_method, "PUT") == 0) &&
          (cl == NULL || to64(cl) > MONGOOSE_POST_SIZE_LIMIT)) {
        send_http_error(conn, 500, "POST size > %lu",
                        (unsigned long) MONGOOSE_POST_SIZE_LIMIT);
      }
    }
#endif
    return;
  }

  if (strcmp(conn->mg_conn.request_method, "CONNECT") == 0 ||
      mg_strncasecmp(conn->mg_conn.uri, "http", 4) == 0) {
    const char *enp = conn->server->config_options[ENABLE_PROXY];
    if (enp == NULL || strcmp(enp, "yes") != 0) {
      send_http_error(conn, 405, NULL);
    } else {
      proxify_connection(conn);
    }
    return;
  }

  if (!strcmp(conn->mg_conn.request_method, "OPTIONS")) {
    send_options(conn);
    return;
  }

#ifdef MONGOOSE_NO_FILESYSTEM
  send_http_error(conn, 404, NULL);
#else
  exists = convert_uri_to_file_name(conn, path, sizeof(path), &st);

  if (!strcmp(conn->mg_conn.request_method, "OPTIONS")) {
    send_options(conn);
  } else if (conn->server->config_options[DOCUMENT_ROOT] == NULL) {
    send_http_error(conn, 404, NULL);
#ifndef MONGOOSE_NO_AUTH
  } else if ((!is_dav_request(conn) && !is_authorized(conn, path,
               exists && S_ISDIR(st.st_mode))) ||
             (is_dav_request(conn) && !is_authorized_for_dav(conn))) {
    mg_send_digest_auth_request(&conn->mg_conn);
    close_local_endpoint(conn);
#endif
#ifndef MONGOOSE_NO_DAV
  } else if (must_hide_file(conn, path)) {
    send_http_error(conn, 404, NULL);
  } else if (!strcmp(conn->mg_conn.request_method, "PROPFIND")) {
    handle_propfind(conn, path, &st, exists);
  } else if (!strcmp(conn->mg_conn.request_method, "MKCOL")) {
    handle_mkcol(conn, path);
  } else if (!strcmp(conn->mg_conn.request_method, "DELETE")) {
    handle_delete(conn, path);
  } else if (!strcmp(conn->mg_conn.request_method, "PUT")) {
    handle_put(conn, path);
#endif
  } else {
    mg_send_file_internal(&conn->mg_conn, path, &st, exists, NULL);
  }
#endif  // MONGOOSE_NO_FILESYSTEM
}